

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

void al_join_thread(ALLEGRO_THREAD *thread,void **ret_value)

{
  undefined8 *in_RSI;
  long in_RDI;
  
  while (*(int *)(in_RDI + 0xa8) == 1) {
    al_rest(7.755294095549e-318);
  }
  switch(*(undefined4 *)(in_RDI + 0xa8)) {
  case 0:
  case 2:
    _al_mutex_lock((_AL_MUTEX *)0x17f3d6);
    *(undefined4 *)(in_RDI + 0xa8) = 3;
    _al_cond_broadcast((_AL_COND *)0x17f3f3);
    _al_mutex_unlock((_AL_MUTEX *)0x17f401);
    _al_cond_destroy((_AL_COND *)0x17f40f);
    _al_mutex_destroy((_AL_MUTEX *)0x17f41d);
    _al_thread_join((_AL_THREAD *)0x17f427);
    *(undefined4 *)(in_RDI + 0xa8) = 4;
    break;
  case 1:
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    break;
  case 6:
  }
  if (in_RSI != (undefined8 *)0x0) {
    *in_RSI = *(undefined8 *)(in_RDI + 0xc0);
  }
  return;
}

Assistant:

void al_join_thread(ALLEGRO_THREAD *thread, void **ret_value)
{
   ASSERT(thread);

   /* If al_join_thread() is called soon after al_start_thread(), the thread
    * function may not yet have noticed the STARTING state and executed the
    * user's thread function.  Hence we must wait until the thread enters the
    * STARTED state.
    */
   while (thread->thread_state == THREAD_STATE_STARTING) {
      al_rest(0.001);
   }

   switch (thread->thread_state) {
      case THREAD_STATE_CREATED: /* fall through */
      case THREAD_STATE_STARTED:
         _al_mutex_lock(&thread->mutex);
         thread->thread_state = THREAD_STATE_JOINING;
         _al_cond_broadcast(&thread->cond);
         _al_mutex_unlock(&thread->mutex);
         _al_cond_destroy(&thread->cond);
         _al_mutex_destroy(&thread->mutex);
         _al_thread_join(&thread->thread);
         thread->thread_state = THREAD_STATE_JOINED;
         break;
      case THREAD_STATE_STARTING:
         ASSERT(thread->thread_state != THREAD_STATE_STARTING);
         break;
      case THREAD_STATE_JOINING:
         ASSERT(thread->thread_state != THREAD_STATE_JOINING);
         break;
      case THREAD_STATE_JOINED:
         ASSERT(thread->thread_state != THREAD_STATE_JOINED);
         break;
      case THREAD_STATE_DESTROYED:
         ASSERT(thread->thread_state != THREAD_STATE_DESTROYED);
         break;
      case THREAD_STATE_DETACHED:
         ASSERT(thread->thread_state != THREAD_STATE_DETACHED);
         break;
   }

   if (ret_value) {
      *ret_value = thread->retval;
   }
}